

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riff.hpp
# Opt level: O1

void __thiscall sf2cute::RIFFChunk::~RIFFChunk(RIFFChunk *this)

{
  ~RIFFChunk(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~RIFFChunk() = default;